

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d8.cpp
# Opt level: O0

void rw::d3d8::defaultInstanceCB(Geometry *geo,InstanceData *inst)

{
  uint32 uVar1;
  int32 iVar2;
  bool32 bVar3;
  void *pvVar4;
  uint8 *dst_00;
  int local_24;
  uint8 *puStack_20;
  int32 i;
  uint8 *dst;
  InstanceData *inst_local;
  Geometry *geo_local;
  
  uVar1 = makeFVFDeclaration(geo->flags,geo->numTexCoordSets);
  inst->vertexShader = uVar1;
  iVar2 = getStride(geo->flags,geo->numTexCoordSets);
  inst->stride = iVar2;
  pvVar4 = d3d::createVertexBuffer(inst->numVertices * inst->stride,inst->vertexShader,false);
  inst->vertexBuffer = pvVar4;
  inst->managed = '\x01';
  dst_00 = d3d::lockVertices(inst->vertexBuffer,0,0,0);
  instV3d(8,dst_00,geo->morphTargets->vertices + inst->minVert,inst->numVertices,inst->stride);
  puStack_20 = dst_00 + 0xc;
  if ((geo->flags & 0x10) != 0) {
    instV3d(8,puStack_20,geo->morphTargets->normals + inst->minVert,inst->numVertices,inst->stride);
    puStack_20 = dst_00 + 0x18;
  }
  inst->vertexAlpha = '\0';
  if ((geo->flags & 8) != 0) {
    bVar3 = instColor(10,puStack_20,geo->colors + inst->minVert,inst->numVertices,inst->stride);
    inst->vertexAlpha = (uint8)bVar3;
    puStack_20 = puStack_20 + 4;
  }
  for (local_24 = 0; local_24 < geo->numTexCoordSets; local_24 = local_24 + 1) {
    instTexCoords(7,puStack_20,geo->texCoords[local_24] + inst->minVert,inst->numVertices,
                  inst->stride);
    puStack_20 = puStack_20 + 8;
  }
  d3d::unlockVertices(inst->vertexBuffer);
  return;
}

Assistant:

void
defaultInstanceCB(Geometry *geo, InstanceData *inst)
{
	inst->vertexShader = makeFVFDeclaration(geo->flags, geo->numTexCoordSets);
	inst->stride = getStride(geo->flags, geo->numTexCoordSets);

	assert(inst->vertexBuffer == nil);
	inst->vertexBuffer = createVertexBuffer(inst->numVertices*inst->stride,
	                                              inst->vertexShader, false);
	inst->managed = 1;

	uint8 *dst = lockVertices(inst->vertexBuffer, 0, 0, D3DLOCK_NOSYSLOCK);
	instV3d(VERT_FLOAT3, dst,
		&geo->morphTargets[0].vertices[inst->minVert],
		inst->numVertices, inst->stride);
	dst += 12;

	if(geo->flags & Geometry::NORMALS){
		instV3d(VERT_FLOAT3, dst,
		        &geo->morphTargets[0].normals[inst->minVert],
		        inst->numVertices, inst->stride);
		dst += 12;
	}

	inst->vertexAlpha = 0;
	if(geo->flags & Geometry::PRELIT){
		inst->vertexAlpha = instColor(VERT_ARGB, dst, &geo->colors[inst->minVert],
		                              inst->numVertices, inst->stride);
		dst += 4;
	}

	for(int32 i = 0; i < geo->numTexCoordSets; i++){
		instTexCoords(VERT_FLOAT2, dst, &geo->texCoords[i][inst->minVert],
		        inst->numVertices, inst->stride);
		dst += 8;
	}
	unlockVertices(inst->vertexBuffer);
}